

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

shared_ptr<helics::Broker>
helics::BrokerFactory::create
          (CoreType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<helics::Broker> sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000080;
  CoreType in_stack_0000008c;
  undefined1 in_stack_00000090 [16];
  undefined4 in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __sv_type local_28;
  undefined4 local_c;
  
  this = in_RDI;
  local_c = in_ESI;
  if (create(helics::CoreType,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
      ::emptyString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&create(helics::CoreType,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
                                 ::emptyString_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(this);
      __cxa_atexit(std::__cxx11::string::~string,
                   &create(helics::CoreType,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
                    ::emptyString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&create(helics::CoreType,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
                           ::emptyString_abi_cxx11_);
    }
  }
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff90);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(local_c,in_stack_ffffffffffffff88));
  create(in_stack_0000008c,(string_view)in_stack_00000090,in_stack_00000080);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, std::vector<std::string> args)
{
    static const std::string emptyString;
    return create(type, emptyString, std::move(args));
}